

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_3_2::copyIntoFrameBuffer
               (char **readPtr,char *writePtr,char *endPtr,size_t xStride,bool fill,double fillValue
               ,Format format,PixelType typeInFrameBuffer,PixelType typeInFile)

{
  ArgExc *pAVar1;
  long in_RCX;
  float *in_RDX;
  float *in_RSI;
  long *in_RDI;
  byte in_R8B;
  int in_R9D;
  float fVar2;
  double in_XMM0_Qa;
  int in_stack_00000008;
  int in_stack_00000010;
  size_t i_5;
  half h_3;
  size_t i_4;
  uint ui_3;
  size_t i_3;
  float f_3;
  int numBytes;
  size_t i_2;
  uint ui_2;
  size_t i_1;
  float f_2;
  half h_2;
  size_t i;
  half h_1;
  uint ui_1;
  float f_1;
  uint ui;
  float f;
  half h;
  float fillVal_2;
  half fillVal_1;
  uint fillVal;
  undefined4 in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  half *in_stack_fffffffffffffeb0;
  ulong local_d0;
  ulong local_c0;
  uint local_b8;
  uint16_t local_b2;
  ulong local_b0;
  undefined1 local_a4 [4];
  int local_a0;
  uint16_t local_9a;
  ulong local_98;
  undefined1 local_8c [4];
  ulong local_88;
  undefined1 local_80 [4];
  undefined2 local_7c;
  undefined2 local_7a;
  ulong local_78;
  uint local_68;
  uint16_t local_62;
  uint16_t local_5a;
  undefined2 local_50;
  undefined2 local_4e;
  uint16_t local_3a;
  byte local_21;
  long local_20;
  float *local_18;
  float *local_10;
  long *local_8;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_21 == 0) {
    if (in_R9D == 1) {
      if (in_stack_00000008 == 0) {
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (uint *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (half *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            local_50 = local_4e;
            fVar2 = (float)halfToUint((half)0x22);
            *local_10 = fVar2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            fVar2 = (float)floatToUint(SUB84(in_stack_fffffffffffffeb0,0));
            *local_10 = fVar2;
          }
        }
      }
      else if (in_stack_00000008 == 1) {
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (uint *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            local_5a = (uint16_t)uintToHalf((uint)in_stack_fffffffffffffeb0);
            *(uint16_t *)local_10 = local_5a;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (half *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            local_62 = (uint16_t)floatToHalf(SUB84(in_stack_fffffffffffffeb0,0));
            *(uint16_t *)local_10 = local_62;
          }
        }
      }
      else {
        if (in_stack_00000008 != 2) {
          pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
          __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (uint *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            *local_10 = (float)local_68;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (half *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            fVar2 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffeb0);
            *local_10 = fVar2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                      ((char **)in_stack_fffffffffffffeb0,
                       (float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          }
        }
      }
    }
    else {
      local_8 = in_RDI;
      if (in_stack_00000008 == 0) {
        if (in_stack_00000010 == 0) {
          for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
            for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
              *(undefined1 *)((long)local_10 + local_78) = *(undefined1 *)(*in_RDI + local_78);
            }
            *in_RDI = *in_RDI + 4;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            local_7c = *(undefined2 *)*local_8;
            local_7a = local_7c;
            fVar2 = (float)halfToUint((half)0x22);
            *local_10 = fVar2;
            *local_8 = *local_8 + 2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
              local_80[local_88] = *(undefined1 *)(*local_8 + local_88);
            }
            fVar2 = (float)floatToUint(SUB84(in_stack_fffffffffffffeb0,0));
            *local_10 = fVar2;
            *local_8 = *local_8 + 4;
          }
        }
      }
      else if (in_stack_00000008 == 1) {
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
              local_8c[local_98] = *(undefined1 *)(*local_8 + local_98);
            }
            local_9a = (uint16_t)uintToHalf((uint)in_stack_fffffffffffffeb0);
            *(uint16_t *)local_10 = local_9a;
            *local_8 = *local_8 + 4;
          }
        }
        else if (in_stack_00000010 == 1) {
          if (in_RCX == 2) {
            local_a0 = ((int)in_RDX - (int)in_RSI) + 2;
            memcpy(in_RSI,(void *)*in_RDI,(long)local_a0);
            *local_8 = *local_8 + (long)local_a0;
          }
          else {
            for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
              *(uint16_t *)local_10 = *(uint16_t *)*in_RDI;
              *in_RDI = *in_RDI + 2;
            }
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
              local_a4[local_b0] = *(undefined1 *)(*local_8 + local_b0);
            }
            local_b2 = (uint16_t)floatToHalf(SUB84(in_stack_fffffffffffffeb0,0));
            *(uint16_t *)local_10 = local_b2;
            *local_8 = *local_8 + 4;
          }
        }
      }
      else {
        if (in_stack_00000008 != 2) {
          pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
          __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        if (in_stack_00000010 == 0) {
          for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
            for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
              *(undefined1 *)((long)&local_b8 + local_c0) = *(undefined1 *)(*in_RDI + local_c0);
            }
            *local_10 = (float)local_b8;
            *in_RDI = *in_RDI + 4;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            fVar2 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffeb0);
            *local_10 = fVar2;
            *local_8 = *local_8 + 2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
            for (local_d0 = 0; local_d0 < 4; local_d0 = local_d0 + 1) {
              *(undefined1 *)((long)local_10 + local_d0) = *(undefined1 *)(*in_RDI + local_d0);
            }
            *in_RDI = *in_RDI + 4;
          }
        }
      }
    }
  }
  else if (in_stack_00000008 == 0) {
    for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
      *local_10 = (float)(long)in_XMM0_Qa;
    }
  }
  else if (in_stack_00000008 == 1) {
    Imath_3_2::half::half(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
      *(uint16_t *)local_10 = local_3a;
    }
  }
  else {
    if (in_stack_00000008 != 2) {
      pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
      __cxa_throw(pAVar1,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
      *local_10 = (float)in_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void
copyIntoFrameBuffer (
    const char*&       readPtr,
    char*              writePtr,
    char*              endPtr,
    size_t             xStride,
    bool               fill,
    double             fillValue,
    Compressor::Format format,
    PixelType          typeInFrameBuffer,
    PixelType          typeInFile)
{
    //
    // Copy a horizontal row of pixels from an input
    // file's line or tile buffer to a frame buffer.
    //

    if (fill)
    {
        //
        // The file contains no data for this channel.
        // Store a default value in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            {
                unsigned int fillVal = (unsigned int) (fillValue);

                while (writePtr <= endPtr)
                {
                    *(unsigned int*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            {
                half fillVal = half (fillValue);

                while (writePtr <= endPtr)
                {
                    *(half*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            {
                float fillVal = float (fillValue);

                while (writePtr <= endPtr)
                {
                    *(float*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //
        // Convert the pixels from the file's machine-
        // independent representation, and store the
        // results in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (
                                readPtr, *(unsigned int*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(unsigned int*) writePtr = halfToUint (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(unsigned int*) writePtr = floatToUint (f);
                            writePtr += xStride;
                        }
                        break;

                    default:
                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(half*) writePtr = uintToHalf (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(half*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(half*) writePtr = floatToHalf (f);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(float*) writePtr = float (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(float*) writePtr = float (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(float*) writePtr);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        // Copy the results into the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h                    = *(half*) readPtr;
                            *(unsigned int*) writePtr = halfToUint (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(unsigned int*) writePtr = floatToUint (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;

                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(half*) writePtr = uintToHalf (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        // If we're tightly packed, just memcpy
                        if (xStride == sizeof (half))
                        {
                            int numBytes = endPtr - writePtr + sizeof (half);
                            memcpy (writePtr, readPtr, numBytes);
                            readPtr += numBytes;
                            writePtr += numBytes;
                        }
                        else
                        {
                            while (writePtr <= endPtr)
                            {
                                *(half*) writePtr = *(half*) readPtr;
                                readPtr += sizeof (half);
                                writePtr += xStride;
                            }
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(half*) writePtr = floatToHalf (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(float*) writePtr = float (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h             = *(half*) readPtr;
                            *(float*) writePtr = float (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (float); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}